

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O2

void __thiscall
diy::stats::ScopedProfile<diy::stats::Profiler>::ScopedProfile
          (ScopedProfile<diy::stats::Profiler> *this,Profiler *prof_,string *name_)

{
  Profiler *this_00;
  string local_30;
  
  this->prof = prof_;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  this->active = true;
  this_00 = this->prof;
  std::__cxx11::string::string((string *)&local_30,(string *)&this->name);
  Profiler::operator<<(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ScopedProfile(Profiler& prof_, std::string name_):
            prof(prof_), name(name_), active(true)  { prof << name; }